

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void attributeDeclDebug(void *ctx,xmlChar *elem,xmlChar *name,int type,int def,xmlChar *defaultValue
                       ,xmlEnumerationPtr tree)

{
  xmlChar *defaultValue_local;
  int def_local;
  int type_local;
  xmlChar *name_local;
  xmlChar *elem_local;
  void *ctx_local;
  
  callbacks = callbacks + 1;
  if (noout == 0) {
    if (defaultValue == (xmlChar *)0x0) {
      fprintf(_stdout,"SAX.attributeDecl(%s, %s, %d, %d, NULL, ...)\n",elem,name,(ulong)(uint)type,
              (ulong)(uint)def);
    }
    else {
      fprintf(_stdout,"SAX.attributeDecl(%s, %s, %d, %d, %s, ...)\n",elem,name,(ulong)(uint)type,
              (ulong)(uint)def,defaultValue);
    }
    xmlFreeEnumeration(tree);
  }
  return;
}

Assistant:

static void
attributeDeclDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar * elem,
                   const xmlChar * name, int type, int def,
                   const xmlChar * defaultValue, xmlEnumerationPtr tree)
{
    callbacks++;
    if (noout)
        return;
    if (defaultValue == NULL)
        fprintf(stdout, "SAX.attributeDecl(%s, %s, %d, %d, NULL, ...)\n",
                elem, name, type, def);
    else
        fprintf(stdout, "SAX.attributeDecl(%s, %s, %d, %d, %s, ...)\n",
                elem, name, type, def, defaultValue);
    xmlFreeEnumeration(tree);
}